

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint64_t farmhashna::Hash64(char *s,size_t len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar11 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                   (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar11 >> 0x2f ^ uVar11) * -0x651e95c4d06fbfb1;
        }
        lVar7 = len * 2 + -0x651e95c4d06fbfb1;
        uVar11 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar7;
        uVar11 = (uVar11 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar11) * lVar7;
        uVar11 = uVar11 >> 0x2f ^ uVar11;
      }
      else {
        uVar11 = *(ulong *)(s + (len - 8));
        lVar7 = len * 2 + -0x651e95c4d06fbfb1;
        uVar4 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar5 = ((uVar4 >> 0x19 | uVar4 << 0x27) + uVar11) * lVar7;
        uVar11 = ((uVar11 >> 0x25 | uVar11 << 0x1b) * lVar7 + uVar4 ^ uVar5) * lVar7;
        uVar11 = (uVar11 >> 0x2f ^ uVar5 ^ uVar11) * lVar7;
        uVar11 = uVar11 >> 0x2f ^ uVar11;
      }
      goto LAB_0017ac50;
    }
    lVar7 = len * 2 + -0x651e95c4d06fbfb1;
    uVar4 = *(long *)(s + (len - 8)) * lVar7;
    uVar11 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar5 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar11 = (uVar4 >> 0x1e | uVar4 << 0x22) + (uVar11 >> 0x2b | uVar11 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar4 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar4;
  }
  else {
    if (0x40 < len) {
      uVar4 = len - 1 & 0xffffffffffffffc0;
      uVar11 = (ulong)((uint)(len - 1) & 0x3f);
      if (s + (len - 0x40) == s + (uVar11 - 0x3f) + uVar4) {
        lVar13 = *(long *)s + 0x1529cba0ca458ff;
        lVar7 = uVar11 + uVar4;
        lVar15 = 0x226bb95b4e64b6d4;
        uVar17 = 0x134a747f856d0526;
        uVar20 = 0;
        lVar12 = 0;
        uVar5 = 0;
        lVar19 = 0;
        lVar6 = 0;
        do {
          lVar1 = uVar20 + 0x30;
          lVar10 = uVar20 + 0x28;
          lVar2 = uVar20 + 0x10;
          lVar9 = lVar6 * -0x4b6d499041670d8d + *(long *)(s + uVar20);
          uVar16 = lVar15 + lVar6 + *(long *)(s + lVar1);
          uVar14 = lVar13 + lVar19 + lVar15 + *(long *)(s + uVar20 + 8);
          uVar18 = *(long *)(s + uVar20 + 8) + lVar9 + *(long *)(s + lVar2);
          lVar15 = lVar19 + *(long *)(s + lVar10) +
                   (uVar16 >> 0x2a | uVar16 * 0x400000) * -0x4b6d499041670d8d;
          lVar6 = uVar20 + 0x18;
          lVar13 = (uVar17 + lVar12 >> 0x21 | (uVar17 + lVar12) * 0x80000000) * -0x4b6d499041670d8d;
          uVar17 = (uVar14 >> 0x25 | uVar14 * 0x8000000) * -0x4b6d499041670d8d ^ uVar5;
          lVar8 = uVar5 + lVar13 + *(long *)(s + uVar20 + 0x20);
          lVar19 = uVar18 + *(long *)(s + lVar6);
          lVar3 = uVar20 + 0x38;
          uVar20 = uVar20 + 0x40;
          uVar5 = lVar12 + lVar9 + *(long *)(s + lVar6) + uVar17;
          uVar14 = *(long *)(s + lVar10) + *(long *)(s + lVar1) + lVar8;
          lVar6 = lVar9 + (uVar18 >> 0x2c | uVar18 * 0x100000) + (uVar5 >> 0x15 | uVar5 << 0x2b);
          uVar5 = *(long *)(s + lVar2) + lVar8 + lVar15 + *(long *)(s + lVar3);
          lVar12 = uVar14 + *(long *)(s + lVar3);
          uVar5 = lVar8 + (uVar14 >> 0x2c | uVar14 * 0x100000) + (uVar5 >> 0x15 | uVar5 << 0x2b);
        } while (uVar4 != uVar20);
        lVar1 = (uVar17 & 0xff) * 2 + -0x4b6d499041670d8d;
        lVar19 = lVar19 + lVar12 + uVar11;
        lVar10 = lVar6 * lVar1 + *(long *)(s + lVar7 + -0x3f);
        lVar12 = lVar12 + uVar11 + lVar19;
        uVar17 = uVar17 + lVar12;
        uVar4 = lVar15 + lVar6 + *(long *)(s + lVar7 + -0xf);
        uVar11 = lVar13 + lVar15 + *(long *)(s + lVar7 + -0x37) + lVar19;
        uVar16 = *(long *)(s + lVar7 + -0x37) + *(long *)(s + lVar7 + -0x2f) + lVar10;
        uVar14 = lVar19 * 9 + *(long *)(s + lVar7 + -0x17) +
                 (uVar4 >> 0x2a | uVar4 * 0x400000) * lVar1;
        uVar20 = uVar5 * 9 ^ (uVar11 >> 0x25 | uVar11 * 0x8000000) * lVar1;
        uVar17 = uVar17 >> 0x21 | uVar17 * 0x80000000;
        lVar6 = uVar17 * lVar1 + uVar5 + *(long *)(s + lVar7 + -0x1f);
        uVar5 = lVar12 + lVar10 + uVar20 + *(long *)(s + lVar7 + -0x27);
        uVar11 = *(long *)(s + lVar7 + -0x17) + *(long *)(s + lVar7 + -0xf) + lVar6;
        uVar4 = uVar11 + *(long *)(s + lVar7 + -7);
        uVar18 = *(long *)(s + lVar7 + -0x2f) + uVar14 + *(long *)(s + lVar7 + -7) + lVar6;
        uVar11 = (uVar11 >> 0x2c | uVar11 * 0x100000) + lVar6 + (uVar18 >> 0x15 | uVar18 << 0x2b);
        uVar18 = (uVar16 + *(long *)(s + lVar7 + -0x27) ^ uVar4) * lVar1;
        uVar5 = ((uVar16 >> 0x2c | uVar16 * 0x100000) + lVar10 + (uVar5 >> 0x15 | uVar5 << 0x2b) ^
                uVar11) * lVar1;
        uVar4 = (uVar18 >> 0x2f ^ uVar4 ^ uVar18) * lVar1;
        uVar11 = (uVar5 >> 0x2f ^ uVar11 ^ uVar5) * lVar1;
        uVar11 = ((uVar11 >> 0x2f ^ uVar11) + uVar17) * lVar1;
        uVar4 = ((uVar14 >> 0x2f ^ uVar14) * -0x3c5a37a36834ced9 + uVar20 +
                 (uVar4 >> 0x2f ^ uVar4) * lVar1 ^ uVar11) * lVar1;
        uVar11 = (uVar4 >> 0x2f ^ uVar11 ^ uVar4) * lVar1;
        return (uVar11 >> 0x2f ^ uVar11) * lVar1;
      }
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                    ,0x226,"uint64_t farmhashna::Hash64(const char *, size_t)");
    }
    lVar7 = len * 2 + -0x651e95c4d06fbfb1;
    lVar6 = *(long *)s * -0x651e95c4d06fbfb1;
    uVar5 = *(long *)(s + (len - 8)) * lVar7;
    uVar11 = lVar6 + *(long *)(s + 8);
    uVar17 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar4 = lVar6 + *(long *)(s + 0x18);
    uVar11 = (uVar5 >> 0x1e | uVar5 << 0x22) + (uVar11 >> 0x2b | uVar11 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar5 = (uVar17 >> 0x12 | uVar17 << 0x2e) + lVar6 + uVar5;
    uVar17 = (uVar11 ^ uVar5) * lVar7;
    uVar20 = (uVar11 + *(long *)(s + (len - 0x20))) * lVar7;
    uVar11 = *(long *)(s + 0x10) * lVar7 + *(long *)(s + 0x18);
    uVar5 = (uVar17 >> 0x2f ^ uVar5 ^ uVar17) * lVar7;
    uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)(s + 0x10) * lVar7 + uVar20;
    uVar11 = (uVar20 >> 0x1e | uVar20 << 0x22) + (uVar11 >> 0x2b | uVar11 * 0x200000) +
             ((uVar5 >> 0x2f ^ uVar5) * lVar7 + *(long *)(s + (len - 0x18))) * lVar7;
  }
  uVar11 = (uVar11 ^ uVar4) * lVar7;
  uVar11 = (uVar11 >> 0x2f ^ uVar4 ^ uVar11) * lVar7;
  uVar11 = uVar11 >> 0x2f ^ uVar11;
LAB_0017ac50:
  return uVar11 * lVar7;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = ShiftMix(y * k2 + 113) * k2;
  pair<uint64_t, uint64_t> v = make_pair(0, 0);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  x = x * k2 + Fetch(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.first += ((len - 1) & 63);
  v.first += w.first;
  w.first += v.first;
  x = Rotate(x + y + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y + v.second + Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first * 9 + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  std::swap(z, x);
  return HashLen16(HashLen16(v.first, w.first, mul) + ShiftMix(y) * k0 + z,
                   HashLen16(v.second, w.second, mul) + x,
                   mul);
}